

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::GetReservoirQuantileDecimalFunction
               (AggregateFunctionSet *set,vector<duckdb::LogicalType,_true> *arguments,
               LogicalType *return_value)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  AggregateFunction fun;
  undefined1 local_3c0 [144];
  LogicalType aLStack_330 [32];
  undefined8 auStack_310 [11];
  code *local_2b8;
  code *local_2b0;
  AggregateOrderDependent local_2a8;
  AggregateDistinctDependent AStack_2a7;
  element_type *local_2a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  undefined1 local_290 [176];
  undefined8 auStack_1e0 [14];
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  undefined1 local_160 [176];
  undefined8 local_b0 [14];
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar4 = 0;
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_3c0,arguments,return_value,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,BindReservoirQuantileDecimal,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  local_2b8 = ReservoirQuantileBindData::Serialize;
  local_2b0 = ReservoirQuantileBindData::Deserialize;
  SimpleFunction::SimpleFunction((SimpleFunction *)local_290,(SimpleFunction *)local_3c0);
  local_290._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_290 + 0x90),aLStack_330);
  local_290[0xa8] = aLStack_330[0x18];
  local_290[0xa9] = aLStack_330[0x19];
  local_290[0xaa] = aLStack_330[0x1a];
  local_290[0xab] = aLStack_330[0x1b];
  local_290._0_8_ = &PTR__AggregateFunction_00890e90;
  puVar2 = auStack_310;
  puVar3 = auStack_1e0;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  auStack_1e0[0xd]._0_1_ = local_2a8;
  auStack_1e0[0xd]._1_1_ = AStack_2a7;
  local_170 = local_2a0;
  local_168._M_pi = local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (set + 0x20),(AggregateFunction *)local_290);
  local_290._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_290);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_3c0 + 0x48),
             (LogicalTypeId *)&LogicalType::INTEGER);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_160,(SimpleFunction *)local_3c0);
  local_160._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_160 + 0x90),aLStack_330);
  local_160[0xa8] = aLStack_330[0x18];
  local_160[0xa9] = aLStack_330[0x19];
  local_160[0xaa] = aLStack_330[0x1a];
  local_160[0xab] = aLStack_330[0x1b];
  local_160._0_8_ = &PTR__AggregateFunction_00890e90;
  puVar2 = auStack_310;
  puVar3 = local_b0;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_b0[0xd]._0_1_ = local_2a8;
  local_b0[0xd]._1_1_ = AStack_2a7;
  local_40 = local_2a0;
  local_38._M_pi = local_298._M_pi;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_298._M_pi)->_M_use_count = (local_298._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (set + 0x20),(AggregateFunction *)local_160);
  local_160._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
  local_3c0._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3c0);
  return;
}

Assistant:

static void GetReservoirQuantileDecimalFunction(AggregateFunctionSet &set, const vector<LogicalType> &arguments,
                                                const LogicalType &return_value) {
	AggregateFunction fun(arguments, return_value, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                      BindReservoirQuantileDecimal);
	fun.serialize = ReservoirQuantileBindData::Serialize;
	fun.deserialize = ReservoirQuantileBindData::Deserialize;
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}